

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_dec.c
# Opt level: O3

int VP8InitFrame(VP8Decoder *dec,VP8Io *io)

{
  VP8FInfo *pVVar1;
  size_t __n;
  byte bVar2;
  int iVar3;
  WebPWorkerInterface *pWVar4;
  uint8_t *puVar5;
  VP8TopSamples *pVVar6;
  int iVar7;
  long lVar8;
  VP8FInfo *pVVar9;
  VP8MBData *pVVar10;
  long lVar11;
  int iVar12;
  uint8_t *puVar13;
  uint uVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  ulong nmemb;
  
  dec->cache_id = 0;
  if (dec->mt_method < 1) {
    dec->num_caches = 1;
    uVar14 = 1;
  }
  else {
    pWVar4 = WebPGetWorkerInterface();
    iVar3 = (*pWVar4->Reset)(&dec->worker);
    if (iVar3 == 0) {
      iVar3 = VP8SetError(dec,VP8_STATUS_OUT_OF_MEMORY,"thread initialization failed.");
      if (iVar3 == 0) {
        return 0;
      }
      uVar14 = dec->num_caches;
    }
    else {
      (dec->worker).data1 = dec;
      (dec->worker).data2 = &(dec->thread_ctx).io;
      (dec->worker).hook = FinishRow;
      uVar14 = 0 < dec->filter_type | 2;
      dec->num_caches = uVar14;
    }
  }
  iVar3 = dec->mb_w;
  lVar16 = (long)iVar3;
  iVar12 = dec->filter_type;
  iVar7 = dec->mt_method;
  if ((long)iVar12 < 1) {
    lVar11 = 0;
  }
  else {
    lVar11 = (long)(iVar3 << (0 < iVar7)) << 2;
  }
  __n = lVar16 * 2 + 2;
  lVar17 = (long)(iVar3 << (iVar7 == 2)) * 800;
  lVar15 = (long)((int)(((uint)""[iVar12] + uVar14 * 0x10) * 3) / 2) * lVar16 * 0x20;
  if (dec->alpha_data == (uint8_t *)0x0) {
    lVar8 = 0;
  }
  else {
    lVar8 = (ulong)(dec->pic_hdr).height * (ulong)(dec->pic_hdr).width;
  }
  nmemb = lVar8 + lVar16 * 0x24 + __n + lVar11 + lVar17 + lVar15 + 0x35f;
  puVar5 = (uint8_t *)dec->mem;
  if (dec->mem_size < nmemb) {
    WebPSafeFree(puVar5);
    dec->mem_size = 0;
    puVar5 = (uint8_t *)WebPSafeMalloc(nmemb,1);
    dec->mem = puVar5;
    if (puVar5 == (uint8_t *)0x0) {
      iVar3 = VP8SetError(dec,VP8_STATUS_OUT_OF_MEMORY,"no memory during frame initialization.");
      if (iVar3 == 0) {
        return 0;
      }
      goto LAB_0012ecec;
    }
    dec->mem_size = nmemb;
    iVar12 = dec->filter_type;
    iVar7 = dec->mt_method;
  }
  dec->intra_t = puVar5;
  pVVar6 = (VP8TopSamples *)(puVar5 + lVar16 * 4);
  dec->yuv_t = pVVar6;
  dec->mb_info = (VP8MB *)(pVVar6[lVar16].y + 2);
  pVVar1 = (VP8FInfo *)(pVVar6[lVar16].y + __n);
  pVVar9 = pVVar1;
  if (lVar11 == 0) {
    pVVar9 = (VP8FInfo *)0x0;
  }
  dec->f_info = pVVar9;
  (dec->thread_ctx).id = 0;
  (dec->thread_ctx).f_info = pVVar9;
  if (iVar12 < 1) {
LAB_0012ebd1:
    puVar5 = (uint8_t *)((ulong)(&pVVar1[7].hev_thresh + lVar11) & 0xffffffffffffffe0);
    dec->yuv_b = puVar5;
    dec->mb_data = (VP8MBData *)(puVar5 + 0x340);
    lVar11 = 0;
    if (iVar7 == 2) {
      lVar11 = lVar16;
    }
    pVVar10 = (VP8MBData *)(puVar5 + lVar11 * 800 + 0x340);
  }
  else {
    if (0 < iVar7) {
      (dec->thread_ctx).f_info = pVVar9 + lVar16;
      goto LAB_0012ebd1;
    }
    puVar5 = (uint8_t *)((ulong)(&pVVar1[7].hev_thresh + lVar11) & 0xffffffffffffffe0);
    dec->yuv_b = puVar5;
    pVVar10 = (VP8MBData *)(puVar5 + 0x340);
    dec->mb_data = pVVar10;
  }
  (dec->thread_ctx).mb_data = pVVar10;
  iVar7 = (int)(lVar16 * 0x10);
  dec->cache_y_stride = iVar7;
  iVar3 = iVar3 * 8;
  dec->cache_uv_stride = iVar3;
  bVar2 = ""[iVar12];
  puVar13 = puVar5 + (ulong)bVar2 * lVar16 * 0x10 + lVar17 + 0x340;
  dec->cache_y = puVar13;
  lVar11 = (long)(int)((uint)(bVar2 >> 1) * iVar3);
  dec->cache_u = puVar13 + lVar11 + (int)(uVar14 * 0x10 * iVar7);
  dec->cache_v = puVar13 + lVar11 + (int)(uVar14 * 0x10 * iVar7) +
                 (int)(uVar14 * iVar3 * 8) + lVar11;
  dec->cache_id = 0;
  puVar5 = puVar5 + lVar15 + lVar17 + 0x340;
  if (lVar8 == 0) {
    puVar5 = (uint8_t *)0x0;
  }
  dec->alpha_plane = puVar5;
  memset(pVVar6 + lVar16,0,__n);
  VP8InitScanline(dec);
  memset(dec->intra_t,0,lVar16 * 4);
LAB_0012ecec:
  io->mb_y = 0;
  puVar5 = dec->cache_u;
  io->y = dec->cache_y;
  io->u = puVar5;
  io->v = dec->cache_v;
  iVar3 = dec->cache_uv_stride;
  io->y_stride = dec->cache_y_stride;
  io->uv_stride = iVar3;
  io->a = (uint8_t *)0x0;
  VP8DspInit();
  return 1;
}

Assistant:

int VP8InitFrame(VP8Decoder* const dec, VP8Io* const io) {
  if (!InitThreadContext(dec)) return 0;  // call first. Sets dec->num_caches.
  if (!AllocateMemory(dec)) return 0;
  InitIo(dec, io);
  VP8DspInit();  // Init critical function pointers and look-up tables.
  return 1;
}